

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O3

void opengv::absolute_pose::modules::gp3p::groebnerRow15_100001_f
               (Matrix<double,_48,_85,_0,_48,_85> *groebnerMatrix,int targetRow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  lVar8 = (long)targetRow;
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[lVar8 + 0x90];
  auVar7._8_8_ = 0x8000000000000000;
  auVar7._0_8_ = 0x8000000000000000;
  auVar9 = vxorpd_avx512vl(auVar10,auVar7);
  auVar11._0_8_ =
       auVar9._0_8_ /
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xd5f];
  auVar11._8_8_ = auVar9._8_8_;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[lVar8 + 0x90] = 0.0;
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe1f];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
                 m_storage.m_data.array[lVar8 + 0x120];
  auVar9 = vfmadd213sd_fma(auVar12,auVar11,auVar9);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[lVar8 + 0x120] = auVar9._0_8_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe4f];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
                 m_storage.m_data.array[lVar8 + 0x1b0];
  auVar9 = vfmadd213sd_fma(auVar13,auVar11,auVar1);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[lVar8 + 0x1b0] = auVar9._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe7f];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
                 m_storage.m_data.array[lVar8 + 0x240];
  auVar9 = vfmadd213sd_fma(auVar14,auVar11,auVar2);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[lVar8 + 0x240] = auVar9._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf3f];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
                 m_storage.m_data.array[lVar8 + 0x7e0];
  auVar9 = vfmadd213sd_fma(auVar15,auVar11,auVar3);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[lVar8 + 0x7e0] = auVar9._0_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf6f];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
                 m_storage.m_data.array[lVar8 + 0x8a0];
  auVar9 = vfmadd213sd_fma(auVar16,auVar11,auVar4);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[lVar8 + 0x8a0] = auVar9._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[3999];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
                 m_storage.m_data.array[lVar8 + 0x990];
  auVar9 = vfmadd213sd_fma(auVar17,auVar11,auVar5);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[lVar8 + 0x990] = auVar9._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xfcf];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
                 m_storage.m_data.array[lVar8 + 0xd80];
  auVar9 = vfmadd213sd_fma(auVar18,auVar11,auVar6);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[lVar8 + 0xd80] = auVar9._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gp3p::groebnerRow15_100001_f( Eigen::Matrix<double,48,85> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,3) / groebnerMatrix(15,71);
  groebnerMatrix(targetRow,3) = 0.0;
  groebnerMatrix(targetRow,6) -= factor * groebnerMatrix(15,75);
  groebnerMatrix(targetRow,9) -= factor * groebnerMatrix(15,76);
  groebnerMatrix(targetRow,12) -= factor * groebnerMatrix(15,77);
  groebnerMatrix(targetRow,42) -= factor * groebnerMatrix(15,81);
  groebnerMatrix(targetRow,46) -= factor * groebnerMatrix(15,82);
  groebnerMatrix(targetRow,51) -= factor * groebnerMatrix(15,83);
  groebnerMatrix(targetRow,72) -= factor * groebnerMatrix(15,84);
}